

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directize.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_157::Directize::run(Directize *this,Module *module)

{
  char **ppcVar1;
  pointer puVar2;
  Table *table_00;
  pointer puVar3;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
  *p_Var4;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
  *this_00;
  bool bVar5;
  mapped_type *pmVar6;
  FlatTable *pFVar7;
  undefined8 *puVar8;
  _Rb_tree_node_base *p_Var9;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *table;
  pointer puVar10;
  pointer puVar11;
  undefined1 auVar12 [8];
  _Base_ptr p_Var13;
  undefined1 auStack_228 [8];
  Name name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [3];
  bool local_1d8;
  pointer local_1d0;
  pointer puStack_1c8;
  pointer local_120;
  pointer pbStack_118;
  pointer local_110;
  _Alloc_hider _Stack_108;
  Module *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e0 [8];
  ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  undefined1 local_80 [8];
  TableInfoMap tables;
  
  if ((module->tables).
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (module->tables).
      super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppcVar1 = &name.super_IString.str._M_str;
    local_80 = (undefined1  [8])&DAT_00000024;
    auStack_228 = (undefined1  [8])ppcVar1;
    auStack_228 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)auStack_228,(ulong)local_80);
    auVar12 = (undefined1  [8])auStack_228;
    name.super_IString.str._M_str = (char *)local_80;
    (((Module *)auStack_228)->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x6e65746e6f632d6c;
    (((Module *)auStack_228)->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x74756d6d692d7374;
    (((Module *)auStack_228)->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7a69746365726964;
    (((Module *)auStack_228)->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x616974696e692d65;
    *(undefined4 *)
     &(((Module *)auStack_228)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = 0x656c6261;
    name.super_IString.str._M_len = (size_t)local_80;
    *(char *)((long)&(((Module *)auStack_228)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)local_80) = '\0';
    bVar5 = Pass::hasArgument(&this->super_Pass,(string *)auVar12);
    tables._M_h._M_single_bucket = (__node_base_ptr)this;
    if (auStack_228 != (undefined1  [8])ppcVar1) {
      auVar12 = (undefined1  [8])(name.super_IString.str._M_str + 1);
      operator_delete((void *)auStack_228,(ulong)auVar12);
    }
    local_80 = (undefined1  [8])&tables._M_h._M_rehash_policy._M_next_resize;
    tables._M_h._M_buckets = (__buckets_ptr)0x1;
    tables._M_h._M_bucket_count = 0;
    tables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    tables._M_h._M_element_count._0_4_ = 0x3f800000;
    tables._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    tables._M_h._M_rehash_policy._4_4_ = 0;
    tables._M_h._M_rehash_policy._M_next_resize = 0;
    puVar10 = (module->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (module->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar10 != puVar2) {
      do {
        pmVar6 = std::
                 unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                 ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                               *)local_80,
                              (key_type *)
                              (puVar10->_M_t).
                              super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                              .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
        pmVar6->initialContentsImmutable = bVar5;
        table_00 = (puVar10->_M_t).
                   super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
        pFVar7 = (FlatTable *)operator_new(0x20);
        TableUtils::FlatTable::FlatTable(pFVar7,module,table_00);
        auStack_228 = (undefined1  [8])pFVar7;
        pmVar6 = std::
                 unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                 ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                               *)local_80,
                              (key_type *)
                              (puVar10->_M_t).
                              super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                              .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
        auVar12 = auStack_228;
        auStack_228 = (undefined1  [8])0x0;
        pFVar7 = (pmVar6->flatTable)._M_t.
                 super___uniq_ptr_impl<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::TableUtils::FlatTable_*,_std::default_delete<wasm::TableUtils::FlatTable>_>
                 .super__Head_base<0UL,_wasm::TableUtils::FlatTable_*,_false>._M_head_impl;
        (pmVar6->flatTable)._M_t.
        super___uniq_ptr_impl<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TableUtils::FlatTable_*,_std::default_delete<wasm::TableUtils::FlatTable>_>
        .super__Head_base<0UL,_wasm::TableUtils::FlatTable_*,_false>._M_head_impl =
             (FlatTable *)auVar12;
        if (pFVar7 != (FlatTable *)0x0) {
          std::default_delete<wasm::TableUtils::FlatTable>::operator()
                    ((default_delete<wasm::TableUtils::FlatTable> *)&pmVar6->flatTable,pFVar7);
        }
        auVar12 = auStack_228;
        if (auStack_228 != (undefined1  [8])0x0) {
          std::default_delete<wasm::TableUtils::FlatTable>::operator()
                    ((default_delete<wasm::TableUtils::FlatTable> *)auStack_228,
                     (FlatTable *)auStack_228);
        }
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar2);
    }
    puVar10 = (module->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (module->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar10 != puVar2) {
      do {
        auVar12 = (undefined1  [8])
                  (puVar10->_M_t).
                  super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
        if (*(pointer *)
             &((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                *)((long)&((Module *)auVar12)->functions + 8))->
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            != (pointer)0x0) {
          pmVar6 = std::
                   unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                   ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                                 *)local_80,(key_type *)auVar12);
          pmVar6->mayBeModified = true;
        }
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar2);
    }
    puVar11 = (module->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (module->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar8 = (undefined8 *)tables._M_h._M_bucket_count;
    if (puVar11 != puVar3) {
      do {
        auVar12 = (undefined1  [8])
                  (puVar11->_M_t).
                  super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                  super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        if (*(int *)((long)&((Module *)auVar12)->exports + 0x10) == 1) {
          if (*(char *)((long)&(((Module *)auVar12)->functions).
                               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       + 0x10) == '\0') {
            auVar12 = (undefined1  [8])&((Module *)auVar12)->functions;
          }
          else {
            auVar12 = (undefined1  [8])0x0;
          }
          pmVar6 = std::
                   unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                   ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                                 *)local_80,(key_type *)auVar12);
          pmVar6->mayBeModified = true;
        }
        puVar11 = puVar11 + 1;
        puVar8 = (undefined8 *)tables._M_h._M_bucket_count;
      } while (puVar11 != puVar3);
    }
    while ((puVar8 != (undefined8 *)0x0 &&
           (((*(char *)(puVar8 + 3) == '\x01' && (*(char *)((long)puVar8 + 0x19) != '\x01')) ||
            (*(char *)(puVar8[4] + 0x18) == '\0'))))) {
      puVar8 = (undefined8 *)*puVar8;
    }
    this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
               *)tables._M_h._M_bucket_count;
    if (puVar8 != (undefined8 *)0x0) {
      analysis._48_8_ = 0;
      wasm::ModuleUtils::
      ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
      ::ParallelFunctionAnalysis
                ((ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                  *)local_e0,module,(Func *)&analysis.field_0x30);
      std::
      _Function_handler<void_(wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Directize.cpp:250:16)>
      ::_M_manager((_Any_data *)&analysis.field_0x30,(_Any_data *)&analysis.field_0x30,
                   __destroy_functor);
      puVar8 = (undefined8 *)tables._M_h._M_bucket_count;
      if ((undefined1 *)analysis._24_8_ != &analysis.field_0x8) {
        p_Var9 = (_Rb_tree_node_base *)analysis._24_8_;
        do {
          for (p_Var13 = p_Var9[1]._M_right; p_Var13 != (_Base_ptr)0x0;
              p_Var13 = *(_Base_ptr *)p_Var13) {
            auStack_228 = (undefined1  [8])p_Var13->_M_parent;
            name.super_IString.str._M_len = (size_t)p_Var13->_M_left;
            pmVar6 = std::
                     unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                     ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                                   *)local_80,(key_type *)auStack_228);
            pmVar6->mayBeModified = true;
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          puVar8 = (undefined8 *)tables._M_h._M_bucket_count;
        } while (p_Var9 != (_Rb_tree_node_base *)&analysis.field_0x8);
      }
      while ((puVar8 != (undefined8 *)0x0 &&
             (((*(char *)(puVar8 + 3) == '\x01' && (*(char *)((long)puVar8 + 0x19) != '\x01')) ||
              (*(char *)(puVar8[4] + 0x18) == '\0'))))) {
        puVar8 = (undefined8 *)*puVar8;
      }
      auVar12 = (undefined1  [8])tables._M_h._M_single_bucket;
      if (puVar8 != (undefined8 *)0x0) {
        name.super_IString.str._M_str = (char *)local_208;
        local_208[0]._M_local_buf[0] = '\0';
        local_1d8 = false;
        local_1d0 = (pointer)0x0;
        puStack_1c8 = (pointer)0x0;
        local_120 = (pointer)0x0;
        pbStack_118 = (pointer)0x0;
        local_110 = (pointer)0x0;
        _Stack_108._M_p = (pointer)0x0;
        local_100 = (Module *)0x0;
        auStack_228 = (undefined1  [8])&PTR__WalkerPass_01091f60;
        local_f8._M_allocated_capacity = (size_type)local_80;
        local_f8._M_local_buf[8] = '\0';
        name.super_IString.str._M_len = (size_t)tables._M_h._M_single_bucket[1]._M_nxt;
        WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
        ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
               *)auStack_228,module);
        auVar12 = (undefined1  [8])module;
        if (local_120 != (pointer)0x0) {
          auVar12 = (undefined1  [8])((long)local_110 - (long)local_120);
          operator_delete(local_120,(ulong)auVar12);
        }
        Pass::~Pass((Pass *)auStack_228);
      }
      std::
      _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                   *)&analysis);
      this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
                 *)tables._M_h._M_bucket_count;
    }
    while (this_00 !=
           (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
            *)0x0) {
      p_Var4 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
                 **)this_00;
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>,_true>_>_>
      ::_M_deallocate_node(this_00,(__node_ptr)auVar12);
      this_00 = p_Var4;
    }
    memset((void *)local_80,0,(long)tables._M_h._M_buckets << 3);
    tables._M_h._M_bucket_count = 0;
    tables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((undefined1  [8])&tables._M_h._M_rehash_policy._M_next_resize != local_80) {
      operator_delete((void *)local_80,(long)tables._M_h._M_buckets << 3);
    }
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (module->tables.empty()) {
      return;
    }

    // TODO: consider a per-table option here
    auto initialContentsImmutable =
      hasArgument("directize-initial-contents-immutable");

    // Set up the initial info.
    TableInfoMap tables;
    for (auto& table : module->tables) {
      tables[table->name].initialContentsImmutable = initialContentsImmutable;
      tables[table->name].flatTable =
        std::make_unique<TableUtils::FlatTable>(*module, *table);
    }

    // Next, look at the imports and exports.

    for (auto& table : module->tables) {
      if (table->imported()) {
        tables[table->name].mayBeModified = true;
      }
    }

    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Table) {
        tables[*ex->getInternalName()].mayBeModified = true;
      }
    }

    // This may already be enough information to know that we can't optimize
    // anything. If so, skip scanning all the module contents.
    auto canOptimize = [&]() {
      for (auto& [_, info] : tables) {
        if (info.canOptimize()) {
          return true;
        }
      }
      return false;
    };

    if (!canOptimize()) {
      return;
    }

    // Find which tables have sets.

    using TablesWithSet = std::unordered_set<Name>;

    ModuleUtils::ParallelFunctionAnalysis<TablesWithSet> analysis(
      *module, [&](Function* func, TablesWithSet& tablesWithSet) {
        if (func->imported()) {
          return;
        }

        struct Finder : public PostWalker<Finder> {
          TablesWithSet& tablesWithSet;

          Finder(TablesWithSet& tablesWithSet) : tablesWithSet(tablesWithSet) {}

          void visitTableSet(TableSet* curr) {
            tablesWithSet.insert(curr->table);
          }
          void visitTableFill(TableFill* curr) {
            tablesWithSet.insert(curr->table);
          }
          void visitTableCopy(TableCopy* curr) {
            tablesWithSet.insert(curr->destTable);
          }
          void visitTableInit(TableInit* curr) {
            tablesWithSet.insert(curr->table);
          }
        };

        Finder(tablesWithSet).walkFunction(func);
      });

    for (auto& [_, names] : analysis.map) {
      for (auto name : names) {
        tables[name].mayBeModified = true;
      }
    }

    // Perhaps the new information about tables with sets shows we cannot
    // optimize.
    if (!canOptimize()) {
      return;
    }

    // We can optimize!
    FunctionDirectizer(tables).run(getPassRunner(), module);
  }